

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O3

void Omega_h::sort_by_high_index(LOs *l2lh,Write<int> *lh2h,Write<signed_char> *codes)

{
  size_t *psVar1;
  ulong uVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  pointer pcVar6;
  long *plVar7;
  undefined8 *puVar8;
  Alloc *pAVar9;
  long lVar10;
  ulong *puVar11;
  ulong *puVar12;
  ulong uVar13;
  Alloc *pAVar14;
  void *pvVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer omega_h_scoped_function_timer_1;
  string __str;
  type f;
  size_type __dnew;
  ScopedTimer local_112;
  ScopedTimer local_111;
  Alloc *local_110;
  void *local_108;
  undefined1 local_100 [32];
  ulong *local_e0;
  void *local_d8;
  ulong local_d0;
  Alloc *pAStack_c8;
  Alloc *local_c0;
  ulong *local_b8;
  undefined1 local_b0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  Alloc *local_88;
  pointer pcStack_80;
  Alloc *local_78;
  Alloc *local_70;
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  ulong local_48;
  Alloc *local_40;
  Alloc *local_38;
  
  local_e0 = &local_d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,"");
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
  puVar12 = (ulong *)((long)local_b0 + 0x28);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_88 = (Alloc *)*puVar11;
    pcStack_80 = (pointer)plVar7[3];
    local_98._M_allocated_capacity = (size_type)puVar12;
  }
  else {
    local_88 = (Alloc *)*puVar11;
    local_98._M_allocated_capacity = (size_type)(ulong *)*plVar7;
  }
  local_98._8_8_ = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_c0 = (Alloc *)local_b0;
  std::__cxx11::string::_M_construct((ulong)&local_c0,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_c0,3,0xb4);
  pAVar14 = (Alloc *)(void *)0xf;
  if ((ulong *)local_98._M_allocated_capacity != puVar12) {
    pAVar14 = local_88;
  }
  if (pAVar14 < (void *)((long)local_b8 + local_98._8_8_)) {
    pvVar15 = (void *)0xf;
    if (local_c0 != (Alloc *)local_b0) {
      pvVar15 = (void *)local_b0._0_8_;
    }
    if (pvVar15 < (void *)((long)local_b8 + local_98._8_8_)) goto LAB_001c962c;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_c0,0,(char *)0x0,local_98._M_allocated_capacity);
  }
  else {
LAB_001c962c:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)((long)local_b0 + 0x18),(ulong)local_c0);
  }
  local_110 = (Alloc *)local_100;
  psVar1 = puVar8 + 2;
  if ((size_t *)*puVar8 == psVar1) {
    local_100._0_8_ = *psVar1;
    local_100._8_8_ = puVar8[3];
  }
  else {
    local_100._0_8_ = *psVar1;
    local_110 = (Alloc *)*puVar8;
  }
  local_108 = (void *)puVar8[1];
  *puVar8 = psVar1;
  puVar8[1] = 0;
  *(char *)psVar1 = '\0';
  begin_code("sort_by_high_index",(char *)local_110);
  if (local_110 != (Alloc *)local_100) {
    operator_delete(local_110,local_100._0_8_ + 1);
  }
  if (local_c0 != (Alloc *)local_b0) {
    operator_delete(local_c0,local_b0._0_8_ + 1);
  }
  if ((ulong *)local_98._M_allocated_capacity != puVar12) {
    operator_delete((void *)local_98._M_allocated_capacity,(long)local_88 + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  local_98._M_allocated_capacity = (size_type)(l2lh->write_).shared_alloc_.alloc;
  if ((local_98._M_allocated_capacity & 1) == 0) {
    local_48 = ((Alloc *)local_98._M_allocated_capacity)->size;
  }
  else {
    local_48 = local_98._M_allocated_capacity >> 3;
  }
  if ((local_98._M_allocated_capacity & 7) == 0 &&
      (Alloc *)local_98._M_allocated_capacity != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98._M_allocated_capacity = ((Alloc *)local_98._M_allocated_capacity)->size * 8 + 1;
    }
    else {
      ((Alloc *)local_98._M_allocated_capacity)->use_count =
           ((Alloc *)local_98._M_allocated_capacity)->use_count + 1;
    }
  }
  pvVar15 = (l2lh->write_).shared_alloc_.direct_ptr;
  local_88 = (lh2h->shared_alloc_).alloc;
  if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88 = (Alloc *)(local_88->size * 8 + 1);
    }
    else {
      local_88->use_count = local_88->use_count + 1;
    }
  }
  pcVar6 = (pointer)(lh2h->shared_alloc_).direct_ptr;
  local_78 = (codes->shared_alloc_).alloc;
  if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78 = (Alloc *)(local_78->size * 8 + 1);
    }
    else {
      local_78->use_count = local_78->use_count + 1;
    }
  }
  pAVar14 = (Alloc *)(codes->shared_alloc_).direct_ptr;
  local_68 = (ulong *)0x5d;
  local_c0 = (Alloc *)local_b0;
  local_b0._16_8_ = local_78;
  local_98._8_8_ = pvVar15;
  pcStack_80 = pcVar6;
  local_70 = pAVar14;
  local_40 = local_88;
  local_38 = (Alloc *)local_98._M_allocated_capacity;
  pAVar9 = (Alloc *)std::__cxx11::string::_M_create((ulong *)&local_c0,(ulong)&local_68);
  puVar12 = local_68;
  local_b0._0_8_ = local_68;
  local_c0 = pAVar9;
  memcpy(pAVar9,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_b8 = puVar12;
  *(undefined1 *)((long)&pAVar9->size + (long)puVar12) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_c0);
  puVar12 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar12) {
    local_d0 = *puVar12;
    pAStack_c8 = (Alloc *)plVar7[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *puVar12;
    local_e0 = (ulong *)*plVar7;
  }
  local_d8 = (void *)plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_68 = local_58;
  std::__cxx11::string::_M_construct((ulong)&local_68,'\x02');
  *(undefined2 *)local_68 = 0x3438;
  uVar22 = 0xf;
  if (local_e0 != &local_d0) {
    uVar22 = local_d0;
  }
  if (uVar22 < (ulong)(local_60 + (long)local_d8)) {
    uVar22 = 0xf;
    if (local_68 != local_58) {
      uVar22 = local_58[0];
    }
    if ((ulong)(local_60 + (long)local_d8) <= uVar22) {
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_e0)
      ;
      goto LAB_001c9965;
    }
  }
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_68);
LAB_001c9965:
  local_110 = (Alloc *)local_100;
  pAVar9 = (Alloc *)(plVar7 + 2);
  if ((Alloc *)*plVar7 == pAVar9) {
    local_100._0_8_ = pAVar9->size;
    local_100._8_8_ = plVar7[3];
  }
  else {
    local_100._0_8_ = pAVar9->size;
    local_110 = (Alloc *)*plVar7;
  }
  local_108 = (void *)plVar7[1];
  *plVar7 = (long)pAVar9;
  plVar7[1] = 0;
  *(undefined1 *)&pAVar9->size = 0;
  begin_code("parallel_for",(char *)local_110);
  if (local_110 != (Alloc *)local_100) {
    operator_delete(local_110,(ulong)((long)(size_t *)local_100._0_8_ + 1));
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  uVar22 = local_48 >> 2;
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if (local_c0 != (Alloc *)local_b0) {
    operator_delete(local_c0,local_b0._0_8_ + 1);
  }
  iVar21 = (int)uVar22;
  if (1 < iVar21) {
    local_110 = local_38;
    if (((ulong)local_38 & 7) == 0 && local_38 != (Alloc *)0x0) {
      local_110 = (Alloc *)(local_38->size * 8 + 1);
    }
    local_100._0_8_ = local_40;
    if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
      local_100._0_8_ = local_40->size * 8 + 1;
    }
    local_100._16_8_ = local_b0._16_8_;
    if ((local_b0._16_8_ & 7) == 0 && (Alloc *)local_b0._16_8_ != (Alloc *)0x0) {
      local_100._16_8_ = *(size_t *)local_b0._16_8_ * 8 + 1;
    }
    entering_parallel = '\0';
    lVar10 = 0;
    do {
      iVar4 = *(int *)((long)pvVar15 + lVar10 * 4);
      iVar16 = *(int *)((long)pvVar15 + lVar10 * 4 + 4);
      uVar13 = (ulong)iVar16;
      uVar22 = (long)iVar4;
      if (iVar4 < iVar16) {
        do {
          uVar2 = uVar22 + 1;
          iVar4 = *(int *)(pcVar6 + uVar22 * 4);
          if ((long)uVar2 < (long)uVar13) {
            uVar17 = uVar22 & 0xffffffff;
            uVar20 = uVar2;
            iVar19 = iVar4;
            do {
              iVar5 = *(int *)(pcVar6 + uVar20 * 4);
              if (iVar5 < iVar19) {
                uVar17 = uVar20 & 0xffffffff;
              }
              iVar16 = (int)uVar17;
              if (iVar5 <= iVar19) {
                iVar19 = iVar5;
              }
              uVar20 = uVar20 + 1;
            } while ((long)uVar20 < (long)uVar13);
          }
          else {
            iVar16 = (int)uVar22;
          }
          lVar18 = (long)iVar16;
          *(undefined4 *)(pcVar6 + uVar22 * 4) = *(undefined4 *)(pcVar6 + lVar18 * 4);
          *(int *)(pcVar6 + lVar18 * 4) = iVar4;
          uVar3 = *(undefined1 *)((long)&pAVar14->size + uVar22);
          *(undefined1 *)((long)&pAVar14->size + uVar22) =
               *(undefined1 *)((long)&pAVar14->size + lVar18);
          *(undefined1 *)((long)&pAVar14->size + lVar18) = uVar3;
          uVar22 = uVar2;
        } while (uVar2 != uVar13);
      }
      lVar10 = lVar10 + 1;
    } while (iVar21 + -1 != (int)lVar10);
    local_108 = pvVar15;
    local_100._8_8_ = pcVar6;
    local_100._24_8_ = pAVar14;
    sort_by_high_index(Omega_h::Read<int>,Omega_h::Write<int>,Omega_h::Write<signed_char>)::$_0::
    ~__0((__0 *)&local_110);
  }
  ScopedTimer::~ScopedTimer(&local_111);
  sort_by_high_index(Omega_h::Read<int>,Omega_h::Write<int>,Omega_h::Write<signed_char>)::$_0::~__0
            ((__0 *)((long)local_b0 + 0x18));
  ScopedTimer::~ScopedTimer(&local_112);
  return;
}

Assistant:

void sort_by_high_index(
    LOs const l2lh, Write<LO> const lh2h, Write<I8> const codes) {
  OMEGA_H_TIME_FUNCTION;
  LO const nl = l2lh.size() - 1;
  auto f = OMEGA_H_LAMBDA(LO const l) {
    LO const begin = l2lh[l];
    LO const end = l2lh[l + 1];
    for (LO j = begin; j < end; ++j) {
      LO k_min = j;
      GO min_h = lh2h[j];
      for (LO k = j + 1; k < end; ++k) {
        GO const h = lh2h[k];
        if (h < min_h) {
          k_min = k;
          min_h = h;
        }
      }
      swap2(lh2h[j], lh2h[k_min]);
      swap2(codes[j], codes[k_min]);
    }
  };
  parallel_for(nl, std::move(f));
}